

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void visualizeBigSudoku(tuple<SudokuGitter,_SudokuGitter> *bigGitter)

{
  BigSudokuVisualizer visualizer;
  allocator local_e9;
  string local_e8;
  _Tuple_impl<0UL,_SudokuGitter,_SudokuGitter> local_c8;
  BigSudokuVisualizer local_78;
  
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::_Tuple_impl
            (&local_c8,&bigGitter->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>);
  BigSudokuVisualizer::BigSudokuVisualizer(&local_78,(tuple<SudokuGitter,_SudokuGitter> *)&local_c8)
  ;
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::~_Tuple_impl(&local_c8);
  std::__cxx11::string::string((string *)&local_e8,"output/big.html",&local_e9);
  BigSudokuVisualizer::createHTML(&local_78,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  BigSudokuVisualizer::~BigSudokuVisualizer(&local_78);
  return;
}

Assistant:

void visualizeBigSudoku(tuple<SudokuGitter, SudokuGitter> bigGitter){
    BigSudokuVisualizer visualizer = BigSudokuVisualizer(bigGitter);
    visualizer.createHTML("output/big.html");
}